

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>
Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *core;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *in_RDI;
  
  if (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::
                                 getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)
             EmptyIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::operator_new(0x44689a);
      EmptyIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::EmptyIterator
                ((EmptyIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs*>::
                           getEmpty()::inst);
    }
  }
  VirtualIterator((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)in_RDI,
                  &getEmpty::inst);
  return (VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }